

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_core.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int epfd;
  uint uVar3;
  uint fd;
  int *piVar4;
  pthread_attr_t *__attr;
  long lVar5;
  _epollfd_connfd epollfd_connfd;
  epoll_event ev;
  socklen_t addrlen;
  pthread_t tid;
  sockaddr_in client_addr;
  sockaddr local_3080;
  pthread_attr_t pthread_attr_detach;
  epoll_event events [1024];
  
  if (argc == 2) {
    iVar2 = going_is_file_existed(argv[1]);
    if (iVar2 == -1) {
      perror("going_is_file_existed.");
    }
    else {
      iVar2 = going_parse_config(argv[1]);
      if (iVar2 != -1) {
        iVar2 = going_socket(2,1,0);
        going_set_nonblocking(iVar2);
        going_set_reuse_addr(iVar2);
        local_3080.sa_data[6] = '\0';
        local_3080.sa_data[7] = '\0';
        local_3080.sa_data[8] = '\0';
        local_3080.sa_data[9] = '\0';
        local_3080.sa_data[10] = '\0';
        local_3080.sa_data[0xb] = '\0';
        local_3080.sa_data[0xc] = '\0';
        local_3080.sa_data[0xd] = '\0';
        local_3080.sa_family = 2;
        local_3080.sa_data[0] = 'P';
        local_3080.sa_data[1] = '\0';
        local_3080.sa_data[2] = '\0';
        local_3080.sa_data[3] = '\0';
        local_3080.sa_data[4] = '\0';
        local_3080.sa_data[5] = '\0';
        going_bind(iVar2,&local_3080,0x10);
        going_listen(iVar2,100);
        epfd = going_epoll_create(0x400);
        ev.events = 1;
        ev.data.fd = iVar2;
        going_epoll_add(epfd,iVar2,&ev);
        __attr = (pthread_attr_t *)&pthread_attr_detach;
        pthread_attr_init(__attr);
        pthread_attr_setdetachstate(__attr,1);
LAB_00107acf:
        uVar3 = going_epoll_wait(epfd,events,0x400,-1);
        if (uVar3 == 0xffffffff) goto code_r0x00107ae9;
        goto LAB_00107af3;
      }
      puts("going_parse_config error!");
    }
  }
  else {
    printf("Usage: %s <config_path>\n",*argv);
  }
  exit(-1);
code_r0x00107ae9:
  piVar4 = __errno_location();
  if (*piVar4 != 4) {
LAB_00107af3:
    for (lVar5 = 0; (ulong)uVar3 * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc) {
      iVar1 = *(int *)((long)&events[0].data + lVar5);
      if (iVar1 == iVar2) {
        fd = going_accept(iVar2,(sockaddr *)&client_addr,&addrlen);
        __attr = (pthread_attr_t *)(ulong)fd;
        going_set_nonblocking(fd);
        ev.events = 0x80000001;
        ev.data.fd = fd;
        going_epoll_add(epfd,fd,&ev);
      }
      else {
        ev.data.fd = (int)__attr;
        epollfd_connfd.epollfd = epfd;
        epollfd_connfd.connfd = iVar1;
        going_epoll_del(epfd,ev.data.fd,&ev);
        pthread_create(&tid,(pthread_attr_t *)&pthread_attr_detach,going_thread_func,&epollfd_connfd
                      );
      }
    }
  }
  goto LAB_00107acf;
}

Assistant:

int main(int argc, char const *argv[])
{
	int    			   conn_sock;
	struct epoll_event ev;
	struct epoll_event events[MAXEVENTS];
	struct sockaddr_in server_addr;
	struct sockaddr_in client_addr;
	socklen_t          addrlen;
	pthread_attr_t     pthread_attr_detach;
	_epollfd_connfd    epollfd_connfd;
	pthread_t          tid;

	if(argc != 2){
		printf("Usage: %s <config_path>\n", argv[0]);
		exit(-1);
	}
	//Is configure existed?
	if(-1 == going_is_file_existed(argv[1])){
		perror("going_is_file_existed.");
		exit(-1);
	}
	//parse configure
	if(-1 == going_parse_config(argv[1])){
		printf("going_parse_config error!\n");
		exit(-1);
	}

	//创建监听套接字
	int listen_fd = going_socket(AF_INET, SOCK_STREAM, 0);
	//设置监听套接字为非阻塞模式
	going_set_nonblocking(listen_fd);
	//对套接字设置SO_REUSEADDR选项
	going_set_reuse_addr(listen_fd);


	//通过服务名和协议名获得相应的知名端口
	//struct servent* pservent = going_getservbyname("http", "tcp");
	//uint16_t listen_port = pservent->s_port;
	
	uint16_t listen_port = 80;

	bzero(&server_addr, sizeof(server_addr));
	server_addr.sin_family = AF_INET;
	server_addr.sin_port = (listen_port);
	server_addr.sin_addr.s_addr = htonl(INADDR_ANY);

	going_bind(listen_fd, (struct sockaddr*)&server_addr, sizeof(server_addr));
	going_listen(listen_fd, MAX_BACKLOG);

	// 创建epoll文件描述符
	int epollfd = going_epoll_create(MAXEVENTS);

	// 设置要处理的事件类型
	ev.events = EPOLLIN;
	// 设置与要处理的事件相关的文件描述符
	ev.data.fd = listen_fd;
	// 将监听事件加入epoll中
	going_epoll_add(epollfd, listen_fd, &ev);

	//设置线程属性为detach
	pthread_attr_init(&pthread_attr_detach);
	pthread_attr_setdetachstate(&pthread_attr_detach, PTHREAD_CREATE_DETACHED);

	for(;;){
		// 无限等待直到有描述符就绪
		int nfds = going_epoll_wait(epollfd, events, MAXEVENTS, -1);
		// 若going_epoll_wait被中断则重新调用该函数
		if(nfds == -1 && errno == EINTR)
			continue;

		for(int n = 0; n != nfds; ++n){
			// 处理监听套接字触发的事件
			if(events[n].data.fd == listen_fd){
				conn_sock = going_accept(listen_fd, (struct sockaddr *)&client_addr, &addrlen);
				// 设置新连接上的套接字为非阻塞模式
				going_set_nonblocking(conn_sock);
				// 设置读事件和ET模式
				ev.events = EPOLLIN | EPOLLET;
				ev.data.fd = conn_sock;
				// 将监听事件添加到epoll
				going_epoll_add(epollfd, conn_sock, &ev);
			}else{
				epollfd_connfd.epollfd = epollfd;
				epollfd_connfd.connfd = events[n].data.fd;
				ev.data.fd = conn_sock;
				// epoll不再监听这个事件
				going_epoll_del(epollfd, conn_sock, &ev);
				// 处理连接
				pthread_create(&tid, &pthread_attr_detach, &going_thread_func, (void *)&epollfd_connfd);
			}
		}
	}

	pthread_attr_destroy(&pthread_attr_detach);

	// 关闭监听描述符
	close(listen_fd);
	return 0;
}